

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addQuad
          (TEST_GROUP_CppUTestGroupDoublingFactorCounterTest *this,Tile tile,bool is_open)

{
  undefined7 in_register_00000011;
  PlayerHand *this_00;
  initializer_list<mahjong::Tile> __l;
  initializer_list<mahjong::Tile> __l_00;
  allocator_type local_59;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_58;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_40;
  Tile local_28;
  Tile TStack_24;
  Tile TStack_20;
  Tile TStack_1c;
  
  this_00 = &this->h;
  mahjong::PlayerHand::add(this_00,tile);
  mahjong::PlayerHand::add(this_00,tile);
  mahjong::PlayerHand::add(this_00,tile);
  mahjong::PlayerHand::add(this_00,tile);
  local_28 = tile;
  TStack_24 = tile;
  TStack_20 = tile;
  TStack_1c = tile;
  if ((int)CONCAT71(in_register_00000011,is_open) == 0) {
    __l_00._M_len = 4;
    __l_00._M_array = &local_28;
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_58,__l_00,&local_59);
    mahjong::PlayerHand::bindClosedQuad(this_00,&local_58);
  }
  else {
    __l._M_len = 4;
    __l._M_array = &local_28;
    std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector(&local_40,__l,&local_59);
    mahjong::PlayerHand::bindOpenQuad(this_00,&local_40);
    local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_40.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_40.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
  }
  if (local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void addQuad(Tile tile, bool is_open)
	{
		h.add(tile);
		h.add(tile);
		h.add(tile);
		h.add(tile);

		if (is_open)
		{
			h.bindOpenQuad({ tile,tile,tile,tile });
		}
		else
		{
			h.bindClosedQuad({ tile,tile,tile,tile });
		}
	}